

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::PolyOffsetBuilder::AddPoint(PolyOffsetBuilder *this,IntPoint *pt)

{
  size_type sVar1;
  size_type sVar2;
  size_type len;
  IntPoint *pt_local;
  PolyOffsetBuilder *this_local;
  
  sVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                    (this->m_curr_poly);
  sVar2 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::capacity
                    (this->m_curr_poly);
  if (sVar1 == sVar2) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
              (this->m_curr_poly,sVar1 + 0x80);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (this->m_curr_poly,pt);
  return;
}

Assistant:

void AddPoint(const IntPoint& pt)
{
    Polygon::size_type len = m_curr_poly->size();
    if (len == m_curr_poly->capacity())
        m_curr_poly->reserve(len + buffLength);
    m_curr_poly->push_back(pt);
}